

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O2

char * cvtToDependent(char *prepend,char *path,char *buf,size_t buflen)

{
  char *pcVar1;
  
  if (buf == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    pcVar1 = "";
    if (prepend != (char *)0x0) {
      pcVar1 = prepend;
    }
    snprintf(buf,buflen,"%s%s",pcVar1,path);
  }
  return buf;
}

Assistant:

static char *cvtToDependent(const char *prepend, const char *path,
                            char *buf, const size_t buflen)
{
    BAIL_IF(buf == NULL, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    snprintf(buf, buflen, "%s%s", prepend ? prepend : "", path);

    #if !__PHYSFS_STANDARD_DIRSEP
    assert(__PHYSFS_platformDirSeparator != '/');
    {
        char *p;
        for (p = strchr(buf, '/'); p != NULL; p = strchr(p + 1, '/'))
            *p = __PHYSFS_platformDirSeparator;
    } /* if */
    #endif

    return buf;
}